

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManFilter_rec(If_DsdMan_t *pNew,If_DsdMan_t *p,int i,Vec_Int_t *vMap)

{
  int iVar1;
  If_DsdObj_t *pObj;
  word *pTruth;
  void *pvVar2;
  uint uVar3;
  uint nLits;
  ulong uVar4;
  int pFanins [12];
  int local_68 [14];
  
  iVar1 = Vec_IntEntry(vMap,i);
  if (-1 < iVar1) {
    return;
  }
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,i);
  for (uVar3 = 0; uVar3 < *(uint *)&pObj->field_0x4 >> 0x1b; uVar3 = uVar3 + 1) {
    iVar1 = If_DsdObjFaninLit(pObj,uVar3);
    if (iVar1 == 0) break;
    iVar1 = Abc_Lit2Var(iVar1);
    If_DsdManFilter_rec(pNew,p,iVar1,vMap);
  }
  uVar4 = 0;
  do {
    uVar3 = *(uint *)&pObj->field_0x4;
    nLits = uVar3 >> 0x1b;
    if (nLits <= uVar4) {
LAB_0031fabc:
      if ((uVar3 & 7) == 6) {
        pTruth = If_DsdObjTruth(p,pObj);
      }
      else {
        pTruth = (word *)0x0;
      }
      iVar1 = If_DsdObjFindOrAdd(pNew,uVar3 & 7,local_68,nLits,pTruth);
      uVar3 = *(uint *)&pObj->field_0x4;
      if ((uVar3 >> 8 & 1) != 0) {
        If_DsdVecObjSetMark(&pNew->vObjs,iVar1);
        uVar3 = *(uint *)&pObj->field_0x4;
      }
      pvVar2 = Vec_PtrEntry(&pNew->vObjs,iVar1);
      *(uint *)((long)pvVar2 + 4) = *(uint *)((long)pvVar2 + 4) & 0xf80001ff | uVar3 & 0x7fffe00;
      Vec_IntWriteEntry(vMap,i,iVar1);
      return;
    }
    iVar1 = If_DsdObjFaninLit(pObj,(int)uVar4);
    if (iVar1 == 0) {
      uVar3 = *(uint *)&pObj->field_0x4;
      nLits = uVar3 >> 0x1b;
      goto LAB_0031fabc;
    }
    iVar1 = Abc_Lit2LitV(vMap->pArray,iVar1);
    local_68[uVar4] = iVar1;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void If_DsdManFilter_rec( If_DsdMan_t * pNew, If_DsdMan_t * p, int i, Vec_Int_t * vMap )
{
    If_DsdObj_t * pObj;
    int pFanins[DAU_MAX_VAR];
    int k, iFanin, Id;
    if ( Vec_IntEntry(vMap, i) >= 0 )
        return;
    // call recursively
    pObj = If_DsdVecObj( &p->vObjs, i );
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, k )
        If_DsdManFilter_rec( pNew, p, Abc_Lit2Var(iFanin), vMap );
    // duplicate this one
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, k )
        pFanins[k] = Abc_Lit2LitV( Vec_IntArray(vMap), iFanin );
    Id = If_DsdObjFindOrAdd( pNew, pObj->Type, pFanins, pObj->nFans, pObj->Type == IF_DSD_PRIME ? If_DsdObjTruth(p, pObj) : NULL );
    if ( pObj->fMark )
        If_DsdVecObjSetMark( &pNew->vObjs, Id );
    If_DsdVecObj( &pNew->vObjs, Id )->Count = pObj->Count;
    // save the result
    Vec_IntWriteEntry( vMap, i, Id );
}